

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

WitnessSize __thiscall miniscript::Node<CPubKey>::CalcWitnessSize(Node<CPubKey> *this)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  MaxInt<unsigned_int> MVar8;
  MaxInt<unsigned_int> *pMVar9;
  MaxInt<unsigned_int> *pMVar10;
  size_t j;
  pointer psVar11;
  MaxInt<unsigned_int> MVar12;
  long in_FS_OFFSET;
  WitnessSize WVar13;
  MaxInt<unsigned_int> local_80;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  sats;
  MaxInt<unsigned_int> local_48;
  MaxInt<unsigned_int> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = IsTapscript(this->m_script_ctx);
  uVar6 = 0x49;
  if (bVar3) {
    uVar6 = 0x42;
  }
  bVar3 = IsTapscript(this->m_script_ctx);
  MVar8.value = 0;
  MVar8._0_4_ = this->fragment;
  MVar12.valid = true;
  MVar12._1_3_ = 0;
  MVar12.value = 0;
  switch(MVar8) {
  case (MaxInt<unsigned_int>)0x0:
    break;
  case (MaxInt<unsigned_int>)0x1:
  case (MaxInt<unsigned_int>)0x4:
  case (MaxInt<unsigned_int>)0x5:
    MVar8.valid = true;
    MVar8._1_3_ = 0;
    MVar8.value = 0;
    goto LAB_005f1e4a;
  case (MaxInt<unsigned_int>)0x2:
    MVar12.valid = true;
    MVar12._1_3_ = 0;
    MVar12.value = 1;
    goto LAB_005f1e37;
  case (MaxInt<unsigned_int>)0x3:
    uVar6 = (uVar6 - bVar3) + 0x22;
    uVar4 = (ulong)(bVar3 ^ 0x23);
    goto LAB_005f1e29;
  case (MaxInt<unsigned_int>)0x6:
  case (MaxInt<unsigned_int>)0x7:
  case (MaxInt<unsigned_int>)0x8:
  case (MaxInt<unsigned_int>)0x9:
    MVar8.valid = true;
    MVar8._1_3_ = 0;
    MVar8.value = 0x21;
    goto LAB_005f1e4a;
  case (MaxInt<unsigned_int>)0xa:
  case (MaxInt<unsigned_int>)0xb:
  case (MaxInt<unsigned_int>)0xc:
  case (MaxInt<unsigned_int>)0x10:
    peVar2 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    MVar8 = (peVar2->ws).sat;
    MVar12 = *(MaxInt<unsigned_int> *)((long)&peVar2->ws + 8);
    break;
  case (MaxInt<unsigned_int>)0xd:
    peVar2 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    bVar3 = (peVar2->ws).sat.valid != '\x01';
    if (bVar3) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)(*(uint *)((long)&peVar2->ws + 4) + 2) << 0x20;
    }
    MVar8 = (MaxInt<unsigned_int>)(uVar4 | !bVar3);
    MVar12.valid = true;
    MVar12._1_3_ = 0;
    MVar12.value = 1;
    break;
  case (MaxInt<unsigned_int>)0xe:
    MVar8 = (((((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->ws).sat;
    goto LAB_005f1e4a;
  case (MaxInt<unsigned_int>)0xf:
    MVar12.valid = true;
    MVar12._1_3_ = 0;
    MVar12.value = 1;
    MVar8 = (((((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->ws).sat;
    break;
  case (MaxInt<unsigned_int>)0x11:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar8 = miniscript::internal::operator+
                      (&(((psVar11->
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->ws).sat,
                       &((psVar11[1].
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->ws).sat);
    goto LAB_005f1e4a;
  case (MaxInt<unsigned_int>)0x12:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar8 = miniscript::internal::operator+
                      (&(((psVar11->
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->ws).sat,
                       &((psVar11[1].
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->ws).sat);
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar9 = (MaxInt<unsigned_int> *)
             ((long)&((psVar11->
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->ws + 8);
    pMVar10 = (MaxInt<unsigned_int> *)
              ((long)&(psVar11[1].
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->ws + 8);
    goto LAB_005f1e02;
  case (MaxInt<unsigned_int>)0x13:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            ((MaxInt<unsigned_int> *)
                             ((long)&((psVar11->
                                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->ws + 8),
                             &((psVar11[1].
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->ws).sat);
    pMVar10 = (MaxInt<unsigned_int> *)&sats;
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            (&(((psVar11->
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->ws).sat,
                             (MaxInt<unsigned_int> *)
                             ((long)&(psVar11[1].
                                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->ws + 8));
    pMVar9 = (MaxInt<unsigned_int> *)&next_sats;
    goto LAB_005f1d63;
  case (MaxInt<unsigned_int>)0x14:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar11->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            ((MaxInt<unsigned_int> *)((long)&peVar2->ws + 8),
                             &((psVar11[1].
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->ws).sat);
    MVar8 = miniscript::internal::operator|(&(peVar2->ws).sat,(MaxInt<unsigned_int> *)&sats);
LAB_005f1e4a:
    MVar12.valid = false;
    MVar12._1_3_ = 0;
    MVar12.value = 0;
    break;
  case (MaxInt<unsigned_int>)0x15:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar11->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    pMVar10 = &(peVar2->ws).sat;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            ((MaxInt<unsigned_int> *)((long)&peVar2->ws + 8),
                             &((psVar11[1].
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->ws).sat);
    pMVar9 = (MaxInt<unsigned_int> *)&sats;
LAB_005f1d63:
    MVar8 = miniscript::internal::operator|(pMVar10,pMVar9);
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar9 = (MaxInt<unsigned_int> *)
             ((long)&((psVar11->
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->ws + 8);
    pMVar10 = (MaxInt<unsigned_int> *)
              ((long)&(psVar11[1].
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->ws + 8);
    goto LAB_005f1e02;
  case (MaxInt<unsigned_int>)0x16:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar11->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    uVar4 = (ulong)(peVar2->ws).sat.valid;
    if (uVar4 == 1) {
      uVar5 = (ulong)(*(uint *)((long)&peVar2->ws + 4) + 2) << 0x20;
    }
    else {
      uVar5 = 0;
    }
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar5 | uVar4);
    peVar2 = psVar11[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = (peVar2->ws).sat.valid != '\x01';
    if (bVar3) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)(*(uint *)((long)&peVar2->ws + 4) + 1) << 0x20;
    }
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar4 | !bVar3);
    MVar8 = miniscript::internal::operator|
                      ((MaxInt<unsigned_int> *)&sats,(MaxInt<unsigned_int> *)&next_sats);
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar11->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    uVar4 = (ulong)((MaxInt<unsigned_int> *)((long)&peVar2->ws + 8))->valid;
    if (uVar4 == 1) {
      uVar5 = (ulong)(*(uint *)((long)&peVar2->ws + 0xc) + 2) << 0x20;
    }
    else {
      uVar5 = 0;
    }
    local_40 = (MaxInt<unsigned_int>)(uVar5 | uVar4);
    peVar2 = psVar11[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = ((MaxInt<unsigned_int> *)((long)&peVar2->ws + 8))->valid != true;
    if (bVar3) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)(*(uint *)((long)&peVar2->ws + 0xc) + 1) << 0x20;
    }
    local_48 = (MaxInt<unsigned_int>)(uVar4 | !bVar3);
    MVar12 = miniscript::internal::operator|(&local_40,&local_48);
    break;
  case (MaxInt<unsigned_int>)0x17:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            (&(((psVar11->
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->ws).sat,
                             &((psVar11[1].
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->ws).sat);
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            ((MaxInt<unsigned_int> *)
                             ((long)&((psVar11->
                                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->ws + 8),
                             &((psVar11[2].
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->ws).sat);
    MVar8 = miniscript::internal::operator|
                      ((MaxInt<unsigned_int> *)&sats,(MaxInt<unsigned_int> *)&next_sats);
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar9 = (MaxInt<unsigned_int> *)
             ((long)&((psVar11->
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->ws + 8);
    pMVar10 = (MaxInt<unsigned_int> *)
              ((long)&(psVar11[2].
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->ws + 8);
LAB_005f1e02:
    MVar12 = miniscript::internal::operator+(pMVar9,pMVar10);
    break;
  case (MaxInt<unsigned_int>)0x18:
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(next_sats.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)next_sats.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff);
    Vector<miniscript::internal::MaxInt<unsigned_int>>(&sats,(MaxInt<unsigned_int> *)&next_sats);
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar11 = (this->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar1;
        psVar11 = psVar11 + 1) {
      local_40 = miniscript::internal::operator+
                           (sats.
                            super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            &(((psVar11->
                               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->ws).dsat);
      Vector<miniscript::internal::MaxInt<unsigned_int>>(&next_sats,&local_40);
      lVar7 = 0;
      for (uVar4 = 1;
          uVar4 < (ulong)((long)sats.
                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)sats.
                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1)
      {
        local_48 = miniscript::internal::operator+
                             ((MaxInt<unsigned_int> *)
                              (&sats.
                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].valid + lVar7),
                              &(((psVar11->
                                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->ws).dsat);
        local_80 = miniscript::internal::operator+
                             ((MaxInt<unsigned_int> *)
                              (&(sats.
                                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->valid + lVar7),
                              &(((psVar11->
                                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->ws).sat);
        local_40 = miniscript::internal::operator|(&local_48,&local_80);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&next_sats,&local_40);
        lVar7 = lVar7 + 8;
      }
      local_40 = miniscript::internal::operator+
                           ((MaxInt<unsigned_int> *)
                            ((long)sats.
                                   super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                            ((long)sats.
                                   super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)sats.
                                  super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) + -8),
                            &(((psVar11->
                               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->ws).sat);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
      ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                  *)&next_sats,&local_40);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::_M_move_assign(&sats,(MaxInt<unsigned_int> *)&next_sats);
      std::
      _Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::~_Vector_base((_Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       *)&next_sats);
    }
    if ((ulong)((long)sats.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)sats.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)this->k) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0x483,
                    "internal::WitnessSize miniscript::Node<CPubKey>::CalcWitnessSize() const [Key = CPubKey]"
                   );
    }
    MVar8 = sats.
            super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[this->k];
    MVar12 = *sats.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::~_Vector_base(&sats.
                     super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   );
    break;
  case (MaxInt<unsigned_int>)0x19:
    uVar6 = uVar6 * this->k + 1;
    uVar4 = (ulong)(this->k + 1);
    goto LAB_005f1e29;
  case (MaxInt<unsigned_int>)0x1a:
    uVar4 = ((long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x41;
    uVar6 = (uVar6 - 1) * this->k + (int)uVar4;
LAB_005f1e29:
    MVar12 = (MaxInt<unsigned_int>)((uVar4 << 0x20) + 1);
LAB_005f1e37:
    MVar8 = (MaxInt<unsigned_int>)(((ulong)uVar6 << 0x20) + 1);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x487,
                  "internal::WitnessSize miniscript::Node<CPubKey>::CalcWitnessSize() const [Key = CPubKey]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  WVar13.dsat = MVar12;
  WVar13.sat = MVar8;
  return WVar13;
}

Assistant:

internal::WitnessSize CalcWitnessSize() const {
        const uint32_t sig_size = IsTapscript(m_script_ctx) ? 1 + 65 : 1 + 72;
        const uint32_t pubkey_size = IsTapscript(m_script_ctx) ? 1 + 32 : 1 + 33;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, 0};
            case Fragment::JUST_1:
            case Fragment::OLDER:
            case Fragment::AFTER: return {0, {}};
            case Fragment::PK_K: return {sig_size, 1};
            case Fragment::PK_H: return {sig_size + pubkey_size, 1 + pubkey_size};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {1 + 32, {}};
            case Fragment::ANDOR: {
                const auto sat{(subs[0]->ws.sat + subs[1]->ws.sat) | (subs[0]->ws.dsat + subs[2]->ws.sat)};
                const auto dsat{subs[0]->ws.dsat + subs[2]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::AND_V: return {subs[0]->ws.sat + subs[1]->ws.sat, {}};
            case Fragment::AND_B: return {subs[0]->ws.sat + subs[1]->ws.sat, subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_B: {
                const auto sat{(subs[0]->ws.dsat + subs[1]->ws.sat) | (subs[0]->ws.sat + subs[1]->ws.dsat)};
                const auto dsat{subs[0]->ws.dsat + subs[1]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::OR_C: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), {}};
            case Fragment::OR_D: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_I: return {(subs[0]->ws.sat + 1 + 1) | (subs[1]->ws.sat + 1), (subs[0]->ws.dsat + 1 + 1) | (subs[1]->ws.dsat + 1)};
            case Fragment::MULTI: return {k * sig_size + 1, k + 1};
            case Fragment::MULTI_A: return {k * sig_size + static_cast<uint32_t>(keys.size()) - k, static_cast<uint32_t>(keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S:
            case Fragment::WRAP_C: return subs[0]->ws;
            case Fragment::WRAP_D: return {1 + 1 + subs[0]->ws.sat, 1};
            case Fragment::WRAP_V: return {subs[0]->ws.sat, {}};
            case Fragment::WRAP_J: return {subs[0]->ws.sat, 1};
            case Fragment::THRESH: {
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    auto next_sats = Vector(sats[0] + sub->ws.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ws.dsat) | (sats[j - 1] + sub->ws.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ws.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {sats[k], sats[0]};
            }
        }
        assert(false);
    }